

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ulong uVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [32];
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  size_t k;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar36;
  byte bVar37;
  bool bVar38;
  byte bVar39;
  int iVar40;
  AABBNodeMB4D *node1;
  ulong uVar41;
  long lVar42;
  undefined1 (*pauVar43) [32];
  uint uVar44;
  ulong uVar45;
  ulong *puVar46;
  NodeRef root;
  long lVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar71;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  float fVar76;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar77 [32];
  undefined1 auVar81 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  uint uVar95;
  uint uVar96;
  uint uVar97;
  uint uVar98;
  undefined4 uVar99;
  undefined4 uVar100;
  undefined4 uVar101;
  undefined4 uVar102;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar109 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_false> tray;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  Vec3vf<8> Ng;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  uint local_5df0;
  Precalculations local_5dd1;
  ulong local_5dd0;
  undefined4 local_5dc8;
  uint local_5dc4;
  RayK<8> *local_5dc0;
  Geometry *local_5db8;
  RTCFilterFunctionNArguments local_5db0;
  undefined1 local_5d80 [32];
  BVH *local_5d60;
  Intersectors *local_5d58;
  long local_5d50;
  long local_5d48;
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5d00;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5ce0;
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [8];
  float fStack_5c78;
  float fStack_5c74;
  float fStack_5c70;
  float fStack_5c6c;
  float fStack_5c68;
  undefined1 local_5c60 [8];
  float fStack_5c58;
  float fStack_5c54;
  float fStack_5c50;
  float fStack_5c4c;
  float fStack_5c48;
  undefined1 local_5c40 [8];
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c20;
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  float local_5b00;
  float fStack_5afc;
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  undefined4 uStack_5ae4;
  float local_5ae0;
  float fStack_5adc;
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  undefined4 uStack_5ac4;
  undefined1 local_5ac0 [32];
  int local_5aa0;
  int iStack_5a9c;
  int iStack_5a98;
  int iStack_5a94;
  int iStack_5a90;
  int iStack_5a8c;
  int iStack_5a88;
  int iStack_5a84;
  uint local_5a80;
  uint uStack_5a7c;
  uint uStack_5a78;
  uint uStack_5a74;
  uint uStack_5a70;
  uint uStack_5a6c;
  uint uStack_5a68;
  uint uStack_5a64;
  uint local_5a60;
  uint uStack_5a5c;
  uint uStack_5a58;
  uint uStack_5a54;
  uint uStack_5a50;
  uint uStack_5a4c;
  uint uStack_5a48;
  uint uStack_5a44;
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a00;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5980;
  undefined1 local_5960 [8];
  float fStack_5958;
  float fStack_5954;
  float fStack_5950;
  float fStack_594c;
  float fStack_5948;
  undefined4 uStack_5944;
  undefined1 local_5940 [32];
  uint local_5920;
  uint uStack_591c;
  uint uStack_5918;
  uint uStack_5914;
  uint uStack_5910;
  uint uStack_590c;
  uint uStack_5908;
  uint uStack_5904;
  uint local_5900;
  uint uStack_58fc;
  uint uStack_58f8;
  uint uStack_58f4;
  uint uStack_58f0;
  uint uStack_58ec;
  uint uStack_58e8;
  uint uStack_58e4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_58e0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_58c0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_58a0;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5860;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5840;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5d60 = (BVH *)This->ptr;
  local_5808 = (local_5d60->root).ptr;
  if (local_5808 != 8) {
    auVar54 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar51 = ZEXT816(0) << 0x40;
    uVar49 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar51),5);
    uVar41 = vpcmpeqd_avx512vl(auVar54,(undefined1  [32])valid_i->field_0);
    uVar49 = uVar49 & uVar41;
    bVar39 = (byte)uVar49;
    if (bVar39 != 0) {
      local_5c20._0_4_ = *(undefined4 *)ray;
      local_5c20._4_4_ = *(undefined4 *)(ray + 4);
      local_5c20._8_4_ = *(undefined4 *)(ray + 8);
      local_5c20._12_4_ = *(undefined4 *)(ray + 0xc);
      local_5c20._16_4_ = *(undefined4 *)(ray + 0x10);
      local_5c20._20_4_ = *(undefined4 *)(ray + 0x14);
      local_5c20._24_4_ = *(undefined4 *)(ray + 0x18);
      local_5c20._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_5c20._32_4_ = *(undefined4 *)(ray + 0x20);
      local_5c20._36_4_ = *(undefined4 *)(ray + 0x24);
      local_5c20._40_4_ = *(undefined4 *)(ray + 0x28);
      local_5c20._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_5c20._48_4_ = *(undefined4 *)(ray + 0x30);
      local_5c20._52_4_ = *(undefined4 *)(ray + 0x34);
      local_5c20._56_4_ = *(undefined4 *)(ray + 0x38);
      local_5c20._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_5c20._64_4_ = *(undefined4 *)(ray + 0x40);
      local_5c20._68_4_ = *(undefined4 *)(ray + 0x44);
      local_5c20._72_4_ = *(undefined4 *)(ray + 0x48);
      local_5c20._76_4_ = *(undefined4 *)(ray + 0x4c);
      local_5c20._80_4_ = *(undefined4 *)(ray + 0x50);
      local_5c20._84_4_ = *(undefined4 *)(ray + 0x54);
      local_5c20._88_4_ = *(undefined4 *)(ray + 0x58);
      local_5c20._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_5bc0 = *(undefined1 (*) [32])(ray + 0x80);
      local_5ba0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_5b80 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar57._8_4_ = 0x7fffffff;
      auVar57._0_8_ = 0x7fffffff7fffffff;
      auVar57._12_4_ = 0x7fffffff;
      auVar57._16_4_ = 0x7fffffff;
      auVar57._20_4_ = 0x7fffffff;
      auVar57._24_4_ = 0x7fffffff;
      auVar57._28_4_ = 0x7fffffff;
      auVar54 = vandps_avx(auVar57,local_5bc0);
      auVar52._8_4_ = 0x219392ef;
      auVar52._0_8_ = 0x219392ef219392ef;
      auVar52._12_4_ = 0x219392ef;
      auVar52._16_4_ = 0x219392ef;
      auVar52._20_4_ = 0x219392ef;
      auVar52._24_4_ = 0x219392ef;
      auVar52._28_4_ = 0x219392ef;
      uVar41 = vcmpps_avx512vl(auVar54,auVar52,1);
      bVar38 = (bool)((byte)uVar41 & 1);
      auVar53._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5bc0._0_4_;
      bVar38 = (bool)((byte)(uVar41 >> 1) & 1);
      auVar53._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5bc0._4_4_;
      bVar38 = (bool)((byte)(uVar41 >> 2) & 1);
      auVar53._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5bc0._8_4_;
      bVar38 = (bool)((byte)(uVar41 >> 3) & 1);
      auVar53._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5bc0._12_4_;
      bVar38 = (bool)((byte)(uVar41 >> 4) & 1);
      auVar53._16_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5bc0._16_4_;
      bVar38 = (bool)((byte)(uVar41 >> 5) & 1);
      auVar53._20_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5bc0._20_4_;
      bVar38 = (bool)((byte)(uVar41 >> 6) & 1);
      auVar53._24_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5bc0._24_4_;
      bVar38 = SUB81(uVar41 >> 7,0);
      auVar53._28_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5bc0._28_4_;
      auVar54 = vandps_avx(auVar57,local_5ba0);
      uVar41 = vcmpps_avx512vl(auVar54,auVar52,1);
      bVar38 = (bool)((byte)uVar41 & 1);
      auVar55._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5ba0._0_4_;
      bVar38 = (bool)((byte)(uVar41 >> 1) & 1);
      auVar55._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5ba0._4_4_;
      bVar38 = (bool)((byte)(uVar41 >> 2) & 1);
      auVar55._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5ba0._8_4_;
      bVar38 = (bool)((byte)(uVar41 >> 3) & 1);
      auVar55._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5ba0._12_4_;
      bVar38 = (bool)((byte)(uVar41 >> 4) & 1);
      auVar55._16_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5ba0._16_4_;
      bVar38 = (bool)((byte)(uVar41 >> 5) & 1);
      auVar55._20_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5ba0._20_4_;
      bVar38 = (bool)((byte)(uVar41 >> 6) & 1);
      auVar55._24_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5ba0._24_4_;
      bVar38 = SUB81(uVar41 >> 7,0);
      auVar55._28_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5ba0._28_4_;
      auVar54 = vandps_avx(auVar57,local_5b80);
      uVar41 = vcmpps_avx512vl(auVar54,auVar52,1);
      bVar38 = (bool)((byte)uVar41 & 1);
      auVar54._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5b80._0_4_;
      bVar38 = (bool)((byte)(uVar41 >> 1) & 1);
      auVar54._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5b80._4_4_;
      bVar38 = (bool)((byte)(uVar41 >> 2) & 1);
      auVar54._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5b80._8_4_;
      bVar38 = (bool)((byte)(uVar41 >> 3) & 1);
      auVar54._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5b80._12_4_;
      bVar38 = (bool)((byte)(uVar41 >> 4) & 1);
      auVar54._16_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5b80._16_4_;
      bVar38 = (bool)((byte)(uVar41 >> 5) & 1);
      auVar54._20_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5b80._20_4_;
      bVar38 = (bool)((byte)(uVar41 >> 6) & 1);
      auVar54._24_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5b80._24_4_;
      bVar38 = SUB81(uVar41 >> 7,0);
      auVar54._28_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_5b80._28_4_;
      auVar56._8_4_ = 0x3f800000;
      auVar56._0_8_ = 0x3f8000003f800000;
      auVar56._12_4_ = 0x3f800000;
      auVar56._16_4_ = 0x3f800000;
      auVar56._20_4_ = 0x3f800000;
      auVar56._24_4_ = 0x3f800000;
      auVar56._28_4_ = 0x3f800000;
      auVar52 = vrcp14ps_avx512vl(auVar53);
      auVar17 = vfnmadd213ps_fma(auVar53,auVar52,auVar56);
      auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar52,auVar52);
      auVar53 = vrcp14ps_avx512vl(auVar55);
      auVar18 = vfnmadd213ps_fma(auVar55,auVar53,auVar56);
      auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar53,auVar53);
      auVar53 = vrcp14ps_avx512vl(auVar54);
      auVar19 = vfnmadd213ps_fma(auVar54,auVar53,auVar56);
      local_5b60 = ZEXT1632(auVar17);
      local_5b40 = ZEXT1632(auVar18);
      auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar53,auVar53);
      local_5b20 = ZEXT1632(auVar19);
      local_5b00 = (float)local_5c20._0_4_ * auVar17._0_4_;
      fStack_5afc = (float)local_5c20._4_4_ * auVar17._4_4_;
      fStack_5af8 = (float)local_5c20._8_4_ * auVar17._8_4_;
      fStack_5af4 = (float)local_5c20._12_4_ * auVar17._12_4_;
      fStack_5af0 = (float)local_5c20._16_4_ * 0.0;
      fStack_5aec = (float)local_5c20._20_4_ * 0.0;
      fStack_5ae8 = (float)local_5c20._24_4_ * 0.0;
      local_5ae0 = (float)local_5c20._32_4_ * auVar18._0_4_;
      fStack_5adc = (float)local_5c20._36_4_ * auVar18._4_4_;
      fStack_5ad8 = (float)local_5c20._40_4_ * auVar18._8_4_;
      fStack_5ad4 = (float)local_5c20._44_4_ * auVar18._12_4_;
      fStack_5ad0 = (float)local_5c20._48_4_ * 0.0;
      fStack_5acc = (float)local_5c20._52_4_ * 0.0;
      fStack_5ac8 = (float)local_5c20._56_4_ * 0.0;
      local_5ac0._4_4_ = (float)local_5c20._68_4_ * auVar19._4_4_;
      local_5ac0._0_4_ = (float)local_5c20._64_4_ * auVar19._0_4_;
      local_5ac0._8_4_ = (float)local_5c20._72_4_ * auVar19._8_4_;
      local_5ac0._12_4_ = (float)local_5c20._76_4_ * auVar19._12_4_;
      local_5ac0._16_4_ = (float)local_5c20._80_4_ * 0.0;
      local_5ac0._20_4_ = (float)local_5c20._84_4_ * 0.0;
      local_5ac0._24_4_ = (float)local_5c20._88_4_ * 0.0;
      local_5ac0._28_4_ = local_5c20._92_4_;
      uVar41 = vcmpps_avx512vl(ZEXT1632(auVar17),ZEXT1632(auVar51),1);
      auVar54 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_5aa0 = (uint)((byte)uVar41 & 1) * auVar54._0_4_;
      iStack_5a9c = (uint)((byte)(uVar41 >> 1) & 1) * auVar54._4_4_;
      iStack_5a98 = (uint)((byte)(uVar41 >> 2) & 1) * auVar54._8_4_;
      iStack_5a94 = (uint)((byte)(uVar41 >> 3) & 1) * auVar54._12_4_;
      iStack_5a90 = (uint)((byte)(uVar41 >> 4) & 1) * auVar54._16_4_;
      iStack_5a8c = (uint)((byte)(uVar41 >> 5) & 1) * auVar54._20_4_;
      iStack_5a88 = (uint)((byte)(uVar41 >> 6) & 1) * auVar54._24_4_;
      iStack_5a84 = (uint)(byte)(uVar41 >> 7) * auVar54._28_4_;
      auVar53 = ZEXT1632(auVar51);
      uVar41 = vcmpps_avx512vl(ZEXT1632(auVar18),auVar53,5);
      auVar54 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar38 = (bool)((byte)uVar41 & 1);
      local_5a80 = (uint)bVar38 * auVar54._0_4_ | (uint)!bVar38 * 0x60;
      bVar38 = (bool)((byte)(uVar41 >> 1) & 1);
      uStack_5a7c = (uint)bVar38 * auVar54._4_4_ | (uint)!bVar38 * 0x60;
      bVar38 = (bool)((byte)(uVar41 >> 2) & 1);
      uStack_5a78 = (uint)bVar38 * auVar54._8_4_ | (uint)!bVar38 * 0x60;
      bVar38 = (bool)((byte)(uVar41 >> 3) & 1);
      uStack_5a74 = (uint)bVar38 * auVar54._12_4_ | (uint)!bVar38 * 0x60;
      bVar38 = (bool)((byte)(uVar41 >> 4) & 1);
      uStack_5a70 = (uint)bVar38 * auVar54._16_4_ | (uint)!bVar38 * 0x60;
      bVar38 = (bool)((byte)(uVar41 >> 5) & 1);
      uStack_5a6c = (uint)bVar38 * auVar54._20_4_ | (uint)!bVar38 * 0x60;
      bVar38 = (bool)((byte)(uVar41 >> 6) & 1);
      uStack_5a68 = (uint)bVar38 * auVar54._24_4_ | (uint)!bVar38 * 0x60;
      bVar38 = SUB81(uVar41 >> 7,0);
      uStack_5a64 = (uint)bVar38 * auVar54._28_4_ | (uint)!bVar38 * 0x60;
      uVar41 = vcmpps_avx512vl(ZEXT1632(auVar19),auVar53,5);
      auVar54 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar38 = (bool)((byte)uVar41 & 1);
      local_5a60 = (uint)bVar38 * auVar54._0_4_ | (uint)!bVar38 * 0xa0;
      bVar38 = (bool)((byte)(uVar41 >> 1) & 1);
      uStack_5a5c = (uint)bVar38 * auVar54._4_4_ | (uint)!bVar38 * 0xa0;
      bVar38 = (bool)((byte)(uVar41 >> 2) & 1);
      uStack_5a58 = (uint)bVar38 * auVar54._8_4_ | (uint)!bVar38 * 0xa0;
      bVar38 = (bool)((byte)(uVar41 >> 3) & 1);
      uStack_5a54 = (uint)bVar38 * auVar54._12_4_ | (uint)!bVar38 * 0xa0;
      bVar38 = (bool)((byte)(uVar41 >> 4) & 1);
      uStack_5a50 = (uint)bVar38 * auVar54._16_4_ | (uint)!bVar38 * 0xa0;
      bVar38 = (bool)((byte)(uVar41 >> 5) & 1);
      uStack_5a4c = (uint)bVar38 * auVar54._20_4_ | (uint)!bVar38 * 0xa0;
      bVar38 = (bool)((byte)(uVar41 >> 6) & 1);
      uStack_5a48 = (uint)bVar38 * auVar54._24_4_ | (uint)!bVar38 * 0xa0;
      bVar38 = SUB81(uVar41 >> 7,0);
      uStack_5a44 = (uint)bVar38 * auVar54._28_4_ | (uint)!bVar38 * 0xa0;
      local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar107 = ZEXT3264(local_4680);
      local_5dc8 = (undefined4)uVar49;
      auVar54 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar53);
      local_5a40._0_4_ =
           (uint)(bVar39 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar39 & 1) * local_4680._0_4_;
      bVar38 = (bool)((byte)(uVar49 >> 1) & 1);
      local_5a40._4_4_ = (uint)bVar38 * auVar54._4_4_ | (uint)!bVar38 * local_4680._4_4_;
      bVar38 = (bool)((byte)(uVar49 >> 2) & 1);
      local_5a40._8_4_ = (uint)bVar38 * auVar54._8_4_ | (uint)!bVar38 * local_4680._8_4_;
      bVar38 = (bool)((byte)(uVar49 >> 3) & 1);
      local_5a40._12_4_ = (uint)bVar38 * auVar54._12_4_ | (uint)!bVar38 * local_4680._12_4_;
      bVar38 = (bool)((byte)(uVar49 >> 4) & 1);
      local_5a40._16_4_ = (uint)bVar38 * auVar54._16_4_ | (uint)!bVar38 * local_4680._16_4_;
      bVar38 = (bool)((byte)(uVar49 >> 5) & 1);
      local_5a40._20_4_ = (uint)bVar38 * auVar54._20_4_ | (uint)!bVar38 * local_4680._20_4_;
      bVar38 = (bool)((byte)(uVar49 >> 6) & 1);
      local_5a40._24_4_ = (uint)bVar38 * auVar54._24_4_ | (uint)!bVar38 * local_4680._24_4_;
      bVar38 = SUB81(uVar49 >> 7,0);
      local_5a40._28_4_ = (uint)bVar38 * auVar54._28_4_ | (uint)!bVar38 * local_4680._28_4_;
      auVar54 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar53);
      local_5a20._0_4_ = (uint)(bVar39 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar39 & 1) * -0x800000;
      bVar38 = (bool)((byte)(uVar49 >> 1) & 1);
      local_5a20._4_4_ = (uint)bVar38 * auVar54._4_4_ | (uint)!bVar38 * -0x800000;
      bVar38 = (bool)((byte)(uVar49 >> 2) & 1);
      local_5a20._8_4_ = (uint)bVar38 * auVar54._8_4_ | (uint)!bVar38 * -0x800000;
      bVar38 = (bool)((byte)(uVar49 >> 3) & 1);
      local_5a20._12_4_ = (uint)bVar38 * auVar54._12_4_ | (uint)!bVar38 * -0x800000;
      bVar38 = (bool)((byte)(uVar49 >> 4) & 1);
      local_5a20._16_4_ = (uint)bVar38 * auVar54._16_4_ | (uint)!bVar38 * -0x800000;
      bVar38 = (bool)((byte)(uVar49 >> 5) & 1);
      local_5a20._20_4_ = (uint)bVar38 * auVar54._20_4_ | (uint)!bVar38 * -0x800000;
      bVar38 = (bool)((byte)(uVar49 >> 6) & 1);
      local_5a20._24_4_ = (uint)bVar38 * auVar54._24_4_ | (uint)!bVar38 * -0x800000;
      bVar38 = SUB81(uVar49 >> 7,0);
      local_5a20._28_4_ = (uint)bVar38 * auVar54._28_4_ | (uint)!bVar38 * -0x800000;
      local_5df0 = (uint)(byte)~bVar39;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar49 = 7;
      }
      else {
        uVar49 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      local_5dc0 = ray + 0x100;
      puVar46 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar43 = (undefined1 (*) [32])local_4640;
      local_4660 = local_5a40;
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar108 = ZEXT3264(auVar54);
      auVar51 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
      auVar109 = ZEXT1664(auVar51);
      local_5d58 = This;
      uStack_5ae4 = local_5c20._28_4_;
      uStack_5ac4 = local_5c20._60_4_;
LAB_01dd61e3:
      do {
        do {
          root.ptr = puVar46[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd6c7e;
          puVar46 = puVar46 + -1;
          pauVar43 = pauVar43 + -1;
          auVar54 = *pauVar43;
          auVar106 = ZEXT3264(auVar54);
          uVar41 = vcmpps_avx512vl(auVar54,local_5a20,1);
        } while ((char)uVar41 == '\0');
        uVar1 = (ulong)(uint)POPCOUNT((int)uVar41);
        if (uVar49 < (uint)POPCOUNT((int)uVar41)) {
LAB_01dd6223:
          do {
            lVar42 = -0x20;
            uVar44 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd6c7e;
              uVar13 = vcmpps_avx512vl(auVar106._0_32_,local_5a20,9);
              if ((char)uVar13 == '\0') goto LAB_01dd61e3;
              local_5d50 = (ulong)(uVar44 & 0xf) - 8;
              bVar39 = ~(byte)local_5df0;
              lVar47 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              lVar42 = 0;
              goto LAB_01dd646d;
            }
            uVar41 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            auVar54 = auVar107._0_32_;
            for (; (lVar42 != 0 && (uVar1 = *(ulong *)(uVar41 + 0x40 + lVar42 * 2), uVar1 != 8));
                lVar42 = lVar42 + 4) {
              uVar99 = *(undefined4 *)(uVar41 + 0x120 + lVar42);
              auVar84._4_4_ = uVar99;
              auVar84._0_4_ = uVar99;
              auVar84._8_4_ = uVar99;
              auVar84._12_4_ = uVar99;
              auVar84._16_4_ = uVar99;
              auVar84._20_4_ = uVar99;
              auVar84._24_4_ = uVar99;
              auVar84._28_4_ = uVar99;
              auVar53 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar99 = *(undefined4 *)(uVar41 + 0x60 + lVar42);
              auVar20._4_4_ = uVar99;
              auVar20._0_4_ = uVar99;
              auVar20._8_4_ = uVar99;
              auVar20._12_4_ = uVar99;
              auVar20._16_4_ = uVar99;
              auVar20._20_4_ = uVar99;
              auVar20._24_4_ = uVar99;
              auVar20._28_4_ = uVar99;
              auVar55 = vfmadd213ps_avx512vl(auVar84,auVar53,auVar20);
              uVar99 = *(undefined4 *)(uVar41 + 0x160 + lVar42);
              auVar85._4_4_ = uVar99;
              auVar85._0_4_ = uVar99;
              auVar85._8_4_ = uVar99;
              auVar85._12_4_ = uVar99;
              auVar85._16_4_ = uVar99;
              auVar85._20_4_ = uVar99;
              auVar85._24_4_ = uVar99;
              auVar85._28_4_ = uVar99;
              uVar99 = *(undefined4 *)(uVar41 + 0xa0 + lVar42);
              auVar21._4_4_ = uVar99;
              auVar21._0_4_ = uVar99;
              auVar21._8_4_ = uVar99;
              auVar21._12_4_ = uVar99;
              auVar21._16_4_ = uVar99;
              auVar21._20_4_ = uVar99;
              auVar21._24_4_ = uVar99;
              auVar21._28_4_ = uVar99;
              auVar52 = vfmadd213ps_avx512vl(auVar85,auVar53,auVar21);
              uVar99 = *(undefined4 *)(uVar41 + 0x1a0 + lVar42);
              auVar88._4_4_ = uVar99;
              auVar88._0_4_ = uVar99;
              auVar88._8_4_ = uVar99;
              auVar88._12_4_ = uVar99;
              auVar88._16_4_ = uVar99;
              auVar88._20_4_ = uVar99;
              auVar88._24_4_ = uVar99;
              auVar88._28_4_ = uVar99;
              uVar99 = *(undefined4 *)(uVar41 + 0xe0 + lVar42);
              auVar22._4_4_ = uVar99;
              auVar22._0_4_ = uVar99;
              auVar22._8_4_ = uVar99;
              auVar22._12_4_ = uVar99;
              auVar22._16_4_ = uVar99;
              auVar22._20_4_ = uVar99;
              auVar22._24_4_ = uVar99;
              auVar22._28_4_ = uVar99;
              auVar56 = vfmadd213ps_avx512vl(auVar88,auVar53,auVar22);
              uVar99 = *(undefined4 *)(uVar41 + 0x140 + lVar42);
              auVar89._4_4_ = uVar99;
              auVar89._0_4_ = uVar99;
              auVar89._8_4_ = uVar99;
              auVar89._12_4_ = uVar99;
              auVar89._16_4_ = uVar99;
              auVar89._20_4_ = uVar99;
              auVar89._24_4_ = uVar99;
              auVar89._28_4_ = uVar99;
              uVar99 = *(undefined4 *)(uVar41 + 0x80 + lVar42);
              auVar23._4_4_ = uVar99;
              auVar23._0_4_ = uVar99;
              auVar23._8_4_ = uVar99;
              auVar23._12_4_ = uVar99;
              auVar23._16_4_ = uVar99;
              auVar23._20_4_ = uVar99;
              auVar23._24_4_ = uVar99;
              auVar23._28_4_ = uVar99;
              auVar57 = vfmadd213ps_avx512vl(auVar89,auVar53,auVar23);
              uVar99 = *(undefined4 *)(uVar41 + 0x180 + lVar42);
              auVar91._4_4_ = uVar99;
              auVar91._0_4_ = uVar99;
              auVar91._8_4_ = uVar99;
              auVar91._12_4_ = uVar99;
              auVar91._16_4_ = uVar99;
              auVar91._20_4_ = uVar99;
              auVar91._24_4_ = uVar99;
              auVar91._28_4_ = uVar99;
              uVar99 = *(undefined4 *)(uVar41 + 0xc0 + lVar42);
              auVar24._4_4_ = uVar99;
              auVar24._0_4_ = uVar99;
              auVar24._8_4_ = uVar99;
              auVar24._12_4_ = uVar99;
              auVar24._16_4_ = uVar99;
              auVar24._20_4_ = uVar99;
              auVar24._24_4_ = uVar99;
              auVar24._28_4_ = uVar99;
              auVar58 = vfmadd213ps_avx512vl(auVar91,auVar53,auVar24);
              uVar99 = *(undefined4 *)(uVar41 + 0x1c0 + lVar42);
              auVar93._4_4_ = uVar99;
              auVar93._0_4_ = uVar99;
              auVar93._8_4_ = uVar99;
              auVar93._12_4_ = uVar99;
              auVar93._16_4_ = uVar99;
              auVar93._20_4_ = uVar99;
              auVar93._24_4_ = uVar99;
              auVar93._28_4_ = uVar99;
              uVar99 = *(undefined4 *)(uVar41 + 0x100 + lVar42);
              auVar25._4_4_ = uVar99;
              auVar25._0_4_ = uVar99;
              auVar25._8_4_ = uVar99;
              auVar25._12_4_ = uVar99;
              auVar25._16_4_ = uVar99;
              auVar25._20_4_ = uVar99;
              auVar25._24_4_ = uVar99;
              auVar25._28_4_ = uVar99;
              auVar59 = vfmadd213ps_avx512vl(auVar93,auVar53,auVar25);
              auVar34._4_4_ = fStack_5afc;
              auVar34._0_4_ = local_5b00;
              auVar34._8_4_ = fStack_5af8;
              auVar34._12_4_ = fStack_5af4;
              auVar34._16_4_ = fStack_5af0;
              auVar34._20_4_ = fStack_5aec;
              auVar34._24_4_ = fStack_5ae8;
              auVar34._28_4_ = uStack_5ae4;
              auVar51 = vfmsub213ps_fma(auVar55,local_5b60,auVar34);
              auVar35._4_4_ = fStack_5adc;
              auVar35._0_4_ = local_5ae0;
              auVar35._8_4_ = fStack_5ad8;
              auVar35._12_4_ = fStack_5ad4;
              auVar35._16_4_ = fStack_5ad0;
              auVar35._20_4_ = fStack_5acc;
              auVar35._24_4_ = fStack_5ac8;
              auVar35._28_4_ = uStack_5ac4;
              auVar17 = vfmsub213ps_fma(auVar52,local_5b40,auVar35);
              auVar18 = vfmsub213ps_fma(auVar56,local_5b20,local_5ac0);
              auVar19 = vfmsub213ps_fma(auVar57,local_5b60,auVar34);
              auVar15 = vfmsub213ps_fma(auVar58,local_5b40,auVar35);
              auVar16 = vfmsub213ps_fma(auVar59,local_5b20,local_5ac0);
              auVar55 = vpminsd_avx2(ZEXT1632(auVar51),ZEXT1632(auVar19));
              auVar52 = vpminsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar15));
              auVar55 = vpmaxsd_avx2(auVar55,auVar52);
              auVar52 = vpminsd_avx2(ZEXT1632(auVar18),ZEXT1632(auVar16));
              auVar55 = vpmaxsd_avx2(auVar55,auVar52);
              auVar52 = vpmaxsd_avx2(ZEXT1632(auVar51),ZEXT1632(auVar19));
              auVar56 = vpmaxsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar15));
              auVar56 = vpminsd_avx2(auVar52,auVar56);
              auVar52 = vpmaxsd_avx2(ZEXT1632(auVar18),ZEXT1632(auVar16));
              auVar56 = vpminsd_avx2(auVar56,auVar52);
              auVar52 = vpmaxsd_avx2(auVar55,local_5a40);
              auVar56 = vpminsd_avx2(auVar56,local_5a20);
              uVar50 = vcmpps_avx512vl(auVar52,auVar56,2);
              if ((uVar44 & 7) == 6) {
                uVar99 = *(undefined4 *)(uVar41 + 0x1e0 + lVar42);
                auVar26._4_4_ = uVar99;
                auVar26._0_4_ = uVar99;
                auVar26._8_4_ = uVar99;
                auVar26._12_4_ = uVar99;
                auVar26._16_4_ = uVar99;
                auVar26._20_4_ = uVar99;
                auVar26._24_4_ = uVar99;
                auVar26._28_4_ = uVar99;
                uVar45 = vcmpps_avx512vl(auVar53,auVar26,0xd);
                uVar99 = *(undefined4 *)(uVar41 + 0x200 + lVar42);
                auVar27._4_4_ = uVar99;
                auVar27._0_4_ = uVar99;
                auVar27._8_4_ = uVar99;
                auVar27._12_4_ = uVar99;
                auVar27._16_4_ = uVar99;
                auVar27._20_4_ = uVar99;
                auVar27._24_4_ = uVar99;
                auVar27._28_4_ = uVar99;
                uVar12 = vcmpps_avx512vl(auVar53,auVar27,1);
                uVar50 = uVar50 & uVar45 & uVar12;
              }
              uVar45 = vcmpps_avx512vl(local_5a20,auVar106._0_32_,6);
              uVar50 = uVar50 & uVar45;
              uVar45 = root.ptr;
              auVar60 = auVar54;
              if ((byte)uVar50 != 0) {
                auVar55 = vblendmps_avx512vl(auVar107._0_32_,auVar55);
                bVar38 = (bool)((byte)uVar50 & 1);
                auVar60._0_4_ = (uint)bVar38 * auVar55._0_4_ | (uint)!bVar38 * auVar53._0_4_;
                bVar38 = (bool)((byte)(uVar50 >> 1) & 1);
                auVar60._4_4_ = (uint)bVar38 * auVar55._4_4_ | (uint)!bVar38 * auVar53._4_4_;
                bVar38 = (bool)((byte)(uVar50 >> 2) & 1);
                auVar60._8_4_ = (uint)bVar38 * auVar55._8_4_ | (uint)!bVar38 * auVar53._8_4_;
                bVar38 = (bool)((byte)(uVar50 >> 3) & 1);
                auVar60._12_4_ = (uint)bVar38 * auVar55._12_4_ | (uint)!bVar38 * auVar53._12_4_;
                bVar38 = (bool)((byte)(uVar50 >> 4) & 1);
                auVar60._16_4_ = (uint)bVar38 * auVar55._16_4_ | (uint)!bVar38 * auVar53._16_4_;
                bVar38 = (bool)((byte)(uVar50 >> 5) & 1);
                auVar60._20_4_ = (uint)bVar38 * auVar55._20_4_ | (uint)!bVar38 * auVar53._20_4_;
                bVar38 = (bool)((byte)(uVar50 >> 6) & 1);
                auVar60._24_4_ = (uint)bVar38 * auVar55._24_4_ | (uint)!bVar38 * auVar53._24_4_;
                bVar38 = SUB81(uVar50 >> 7,0);
                auVar60._28_4_ = (uint)bVar38 * auVar55._28_4_ | (uint)!bVar38 * auVar53._28_4_;
                uVar45 = uVar1;
                if (root.ptr != 8) {
                  *puVar46 = root.ptr;
                  puVar46 = puVar46 + 1;
                  *pauVar43 = auVar54;
                  pauVar43 = pauVar43 + 1;
                }
              }
              auVar54 = auVar60;
              root.ptr = uVar45;
            }
            if (root.ptr == 8) goto LAB_01dd6410;
            uVar13 = vcmpps_avx512vl(auVar54,local_5a20,9);
            auVar106 = ZEXT3264(auVar54);
          } while ((byte)uVar49 < (byte)POPCOUNT((int)uVar13));
          *puVar46 = root.ptr;
          puVar46 = puVar46 + 1;
          *pauVar43 = auVar54;
          pauVar43 = pauVar43 + 1;
LAB_01dd6410:
          iVar40 = 4;
        }
        else {
          while( true ) {
            local_5d40 = auVar54;
            local_5dd0 = uVar1;
            auVar51 = auVar109._0_16_;
            bVar39 = (byte)local_5df0;
            if (uVar41 == 0) break;
            k = 0;
            for (uVar1 = uVar41; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            local_5d80._0_8_ = k;
            uVar41 = uVar41 - 1 & uVar41;
            bVar38 = occluded1(local_5d58,local_5d60,root,k,&local_5dd1,ray,
                               (TravRayK<8,_false> *)&local_5c20.field_0,context);
            auVar51 = vxorps_avx512vl(auVar51,auVar51);
            auVar109 = ZEXT1664(auVar51);
            auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar108 = ZEXT3264(auVar54);
            auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar107 = ZEXT3264(auVar54);
            bVar37 = (byte)(1 << (local_5d80._0_4_ & 0x1f));
            if (!bVar38) {
              bVar37 = 0;
            }
            local_5df0 = (uint)(bVar39 | bVar37);
            uVar1 = local_5dd0;
            auVar54 = local_5d40;
          }
          iVar40 = 3;
          auVar106 = ZEXT3264(local_5d40);
          if (bVar39 != 0xff) {
            auVar54 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            local_5a20._0_4_ =
                 (uint)(bVar39 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar39 & 1) * local_5a20._0_4_;
            bVar38 = (bool)((byte)(local_5df0 >> 1) & 1);
            local_5a20._4_4_ = (uint)bVar38 * auVar54._4_4_ | (uint)!bVar38 * local_5a20._4_4_;
            bVar38 = (bool)((byte)(local_5df0 >> 2) & 1);
            local_5a20._8_4_ = (uint)bVar38 * auVar54._8_4_ | (uint)!bVar38 * local_5a20._8_4_;
            bVar38 = (bool)((byte)(local_5df0 >> 3) & 1);
            local_5a20._12_4_ = (uint)bVar38 * auVar54._12_4_ | (uint)!bVar38 * local_5a20._12_4_;
            bVar38 = (bool)((byte)(local_5df0 >> 4) & 1);
            local_5a20._16_4_ = (uint)bVar38 * auVar54._16_4_ | (uint)!bVar38 * local_5a20._16_4_;
            bVar38 = (bool)((byte)(local_5df0 >> 5) & 1);
            local_5a20._20_4_ = (uint)bVar38 * auVar54._20_4_ | (uint)!bVar38 * local_5a20._20_4_;
            bVar38 = (bool)((byte)(local_5df0 >> 6) & 1);
            local_5a20._24_4_ = (uint)bVar38 * auVar54._24_4_ | (uint)!bVar38 * local_5a20._24_4_;
            local_5a20._28_4_ =
                 (local_5df0 >> 7) * auVar54._28_4_ |
                 (uint)!SUB41(local_5df0 >> 7,0) * local_5a20._28_4_;
            iVar40 = 2;
          }
          if ((uint)uVar49 < (uint)local_5dd0) goto LAB_01dd6223;
        }
      } while ((iVar40 == 4) || (iVar40 == 2));
LAB_01dd6c7e:
      bVar39 = (byte)local_5df0;
LAB_01dd6c86:
      bVar39 = bVar39 & (byte)local_5dc8;
      bVar38 = (bool)(bVar39 >> 1 & 1);
      bVar4 = (bool)(bVar39 >> 2 & 1);
      bVar5 = (bool)(bVar39 >> 3 & 1);
      bVar6 = (bool)(bVar39 >> 4 & 1);
      bVar7 = (bool)(bVar39 >> 5 & 1);
      bVar9 = (bool)(bVar39 >> 6 & 1);
      *(uint *)local_5dc0 =
           (uint)(bVar39 & 1) * -0x800000 | (uint)!(bool)(bVar39 & 1) * *(int *)local_5dc0;
      *(uint *)(local_5dc0 + 4) =
           (uint)bVar38 * -0x800000 | (uint)!bVar38 * *(int *)(local_5dc0 + 4);
      *(uint *)(local_5dc0 + 8) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(local_5dc0 + 8);
      *(uint *)(local_5dc0 + 0xc) =
           (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(local_5dc0 + 0xc);
      *(uint *)(local_5dc0 + 0x10) =
           (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_5dc0 + 0x10);
      *(uint *)(local_5dc0 + 0x14) =
           (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_5dc0 + 0x14);
      *(uint *)(local_5dc0 + 0x18) =
           (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_5dc0 + 0x18);
      *(uint *)(local_5dc0 + 0x1c) =
           (uint)(bVar39 >> 7) * -0x800000 |
           (uint)!(bool)(bVar39 >> 7) * *(int *)(local_5dc0 + 0x1c);
    }
  }
  return;
LAB_01dd646d:
  do {
    uVar44 = (uint)bVar39;
    if (lVar42 == local_5d50) goto LAB_01dd6b47;
    lVar48 = -0x10;
    local_5d48 = lVar42;
    do {
      if (lVar48 == 0) goto LAB_01dd6b2a;
      uVar41 = CONCAT44(0,*(uint *)(lVar47 + lVar48));
      local_5d80._0_8_ = uVar41;
      if (uVar41 == 0xffffffff) goto LAB_01dd6b2a;
      auVar54 = *(undefined1 (*) [32])(ray + 0x80);
      auVar53 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar55 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar52 = *(undefined1 (*) [32])(ray + 0xe0);
      uVar99 = *(undefined4 *)(lVar47 + -0x90 + lVar48);
      auVar82._4_4_ = uVar99;
      auVar82._0_4_ = uVar99;
      auVar82._8_4_ = uVar99;
      auVar82._12_4_ = uVar99;
      auVar82._16_4_ = uVar99;
      auVar82._20_4_ = uVar99;
      auVar82._24_4_ = uVar99;
      auVar82._28_4_ = uVar99;
      uVar99 = *(undefined4 *)(lVar47 + -0x80 + lVar48);
      auVar86._4_4_ = uVar99;
      auVar86._0_4_ = uVar99;
      auVar86._8_4_ = uVar99;
      auVar86._12_4_ = uVar99;
      auVar86._16_4_ = uVar99;
      auVar86._20_4_ = uVar99;
      auVar86._24_4_ = uVar99;
      auVar86._28_4_ = uVar99;
      uVar99 = *(undefined4 *)(lVar47 + -0x70 + lVar48);
      auVar90._4_4_ = uVar99;
      auVar90._0_4_ = uVar99;
      auVar90._8_4_ = uVar99;
      auVar90._12_4_ = uVar99;
      auVar90._16_4_ = uVar99;
      auVar90._20_4_ = uVar99;
      auVar90._24_4_ = uVar99;
      auVar90._28_4_ = uVar99;
      uVar99 = *(undefined4 *)(lVar47 + -0x120 + lVar48);
      auVar58._4_4_ = uVar99;
      auVar58._0_4_ = uVar99;
      auVar58._8_4_ = uVar99;
      auVar58._12_4_ = uVar99;
      auVar58._16_4_ = uVar99;
      auVar58._20_4_ = uVar99;
      auVar58._24_4_ = uVar99;
      auVar58._28_4_ = uVar99;
      auVar61 = vfmadd213ps_avx512vl(auVar82,auVar52,auVar58);
      uVar99 = *(undefined4 *)(lVar47 + -0x110 + lVar48);
      auVar59._4_4_ = uVar99;
      auVar59._0_4_ = uVar99;
      auVar59._8_4_ = uVar99;
      auVar59._12_4_ = uVar99;
      auVar59._16_4_ = uVar99;
      auVar59._20_4_ = uVar99;
      auVar59._24_4_ = uVar99;
      auVar59._28_4_ = uVar99;
      auVar62 = vfmadd213ps_avx512vl(auVar86,auVar52,auVar59);
      uVar99 = *(undefined4 *)(lVar47 + -0x100 + lVar48);
      auVar69._4_4_ = uVar99;
      auVar69._0_4_ = uVar99;
      auVar69._8_4_ = uVar99;
      auVar69._12_4_ = uVar99;
      auVar69._16_4_ = uVar99;
      auVar69._20_4_ = uVar99;
      auVar69._24_4_ = uVar99;
      auVar69._28_4_ = uVar99;
      auVar63 = vfmadd213ps_avx512vl(auVar90,auVar52,auVar69);
      uVar99 = *(undefined4 *)(lVar47 + -0x60 + lVar48);
      auVar77._4_4_ = uVar99;
      auVar77._0_4_ = uVar99;
      auVar77._8_4_ = uVar99;
      auVar77._12_4_ = uVar99;
      auVar77._16_4_ = uVar99;
      auVar77._20_4_ = uVar99;
      auVar77._24_4_ = uVar99;
      auVar77._28_4_ = uVar99;
      uVar99 = *(undefined4 *)(lVar47 + -0x50 + lVar48);
      auVar81._4_4_ = uVar99;
      auVar81._0_4_ = uVar99;
      auVar81._8_4_ = uVar99;
      auVar81._12_4_ = uVar99;
      auVar81._16_4_ = uVar99;
      auVar81._20_4_ = uVar99;
      auVar81._24_4_ = uVar99;
      auVar81._28_4_ = uVar99;
      uVar99 = *(undefined4 *)(lVar47 + -0x40 + lVar48);
      auVar94._4_4_ = uVar99;
      auVar94._0_4_ = uVar99;
      auVar94._8_4_ = uVar99;
      auVar94._12_4_ = uVar99;
      auVar94._16_4_ = uVar99;
      auVar94._20_4_ = uVar99;
      auVar94._24_4_ = uVar99;
      auVar94._28_4_ = uVar99;
      uVar99 = *(undefined4 *)(lVar47 + -0xf0 + lVar48);
      auVar11._4_4_ = uVar99;
      auVar11._0_4_ = uVar99;
      auVar11._8_4_ = uVar99;
      auVar11._12_4_ = uVar99;
      auVar11._16_4_ = uVar99;
      auVar11._20_4_ = uVar99;
      auVar11._24_4_ = uVar99;
      auVar11._28_4_ = uVar99;
      auVar59 = vfmadd213ps_avx512vl(auVar77,auVar52,auVar11);
      uVar99 = *(undefined4 *)(lVar47 + -0xe0 + lVar48);
      auVar70._4_4_ = uVar99;
      auVar70._0_4_ = uVar99;
      auVar70._8_4_ = uVar99;
      auVar70._12_4_ = uVar99;
      auVar70._16_4_ = uVar99;
      auVar70._20_4_ = uVar99;
      auVar70._24_4_ = uVar99;
      auVar70._28_4_ = uVar99;
      auVar56 = vfmadd213ps_avx512vl(auVar81,auVar52,auVar70);
      uVar99 = *(undefined4 *)(lVar47 + -0xd0 + lVar48);
      auVar64._4_4_ = uVar99;
      auVar64._0_4_ = uVar99;
      auVar64._8_4_ = uVar99;
      auVar64._12_4_ = uVar99;
      auVar64._16_4_ = uVar99;
      auVar64._20_4_ = uVar99;
      auVar64._24_4_ = uVar99;
      auVar64._28_4_ = uVar99;
      auVar57 = vfmadd213ps_avx512vl(auVar94,auVar52,auVar64);
      uVar99 = *(undefined4 *)(lVar47 + -0x30 + lVar48);
      auVar103._4_4_ = uVar99;
      auVar103._0_4_ = uVar99;
      auVar103._8_4_ = uVar99;
      auVar103._12_4_ = uVar99;
      auVar103._16_4_ = uVar99;
      auVar103._20_4_ = uVar99;
      auVar103._24_4_ = uVar99;
      auVar103._28_4_ = uVar99;
      uVar99 = *(undefined4 *)(lVar47 + -0x20 + lVar48);
      auVar104._4_4_ = uVar99;
      auVar104._0_4_ = uVar99;
      auVar104._8_4_ = uVar99;
      auVar104._12_4_ = uVar99;
      auVar104._16_4_ = uVar99;
      auVar104._20_4_ = uVar99;
      auVar104._24_4_ = uVar99;
      auVar104._28_4_ = uVar99;
      uVar99 = *(undefined4 *)(lVar47 + -0x10 + lVar48);
      auVar105._4_4_ = uVar99;
      auVar105._0_4_ = uVar99;
      auVar105._8_4_ = uVar99;
      auVar105._12_4_ = uVar99;
      auVar105._16_4_ = uVar99;
      auVar105._20_4_ = uVar99;
      auVar105._24_4_ = uVar99;
      auVar105._28_4_ = uVar99;
      uVar99 = *(undefined4 *)(lVar47 + -0xc0 + lVar48);
      auVar65._4_4_ = uVar99;
      auVar65._0_4_ = uVar99;
      auVar65._8_4_ = uVar99;
      auVar65._12_4_ = uVar99;
      auVar65._16_4_ = uVar99;
      auVar65._20_4_ = uVar99;
      auVar65._24_4_ = uVar99;
      auVar65._28_4_ = uVar99;
      auVar64 = vfmadd213ps_avx512vl(auVar103,auVar52,auVar65);
      uVar99 = *(undefined4 *)(lVar47 + -0xb0 + lVar48);
      auVar66._4_4_ = uVar99;
      auVar66._0_4_ = uVar99;
      auVar66._8_4_ = uVar99;
      auVar66._12_4_ = uVar99;
      auVar66._16_4_ = uVar99;
      auVar66._20_4_ = uVar99;
      auVar66._24_4_ = uVar99;
      auVar66._28_4_ = uVar99;
      auVar65 = vfmadd213ps_avx512vl(auVar104,auVar52,auVar66);
      uVar99 = *(undefined4 *)(lVar47 + -0xa0 + lVar48);
      auVar67._4_4_ = uVar99;
      auVar67._0_4_ = uVar99;
      auVar67._8_4_ = uVar99;
      auVar67._12_4_ = uVar99;
      auVar67._16_4_ = uVar99;
      auVar67._20_4_ = uVar99;
      auVar67._24_4_ = uVar99;
      auVar67._28_4_ = uVar99;
      auVar66 = vfmadd213ps_avx512vl(auVar105,auVar52,auVar67);
      auVar52 = vsubps_avx(auVar61,auVar59);
      auVar56 = vsubps_avx(auVar62,auVar56);
      auVar57 = vsubps_avx(auVar63,auVar57);
      auVar58 = vsubps_avx(auVar64,auVar61);
      auVar67 = vsubps_avx512vl(auVar65,auVar62);
      auVar68 = vsubps_avx512vl(auVar66,auVar63);
      auVar69 = vmulps_avx512vl(auVar56,auVar68);
      auVar70 = vfmsub231ps_avx512vl(auVar69,auVar67,auVar57);
      auVar72._4_4_ = auVar57._4_4_ * auVar58._4_4_;
      auVar72._0_4_ = auVar57._0_4_ * auVar58._0_4_;
      auVar72._8_4_ = auVar57._8_4_ * auVar58._8_4_;
      auVar72._12_4_ = auVar57._12_4_ * auVar58._12_4_;
      auVar72._16_4_ = auVar57._16_4_ * auVar58._16_4_;
      auVar72._20_4_ = auVar57._20_4_ * auVar58._20_4_;
      auVar72._24_4_ = auVar57._24_4_ * auVar58._24_4_;
      auVar72._28_4_ = auVar59._28_4_;
      aVar71 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
               vfmsub231ps_avx512vl(auVar72,auVar68,auVar52);
      auVar72 = vmulps_avx512vl(auVar52,auVar67);
      auVar18 = vfmsub231ps_fma(auVar72,auVar58,auVar56);
      auVar59 = vsubps_avx(auVar61,*(undefined1 (*) [32])ray);
      auVar69 = vsubps_avx(auVar62,*(undefined1 (*) [32])(ray + 0x20));
      auVar11 = vsubps_avx(auVar63,*(undefined1 (*) [32])(ray + 0x40));
      auVar61._4_4_ = auVar53._4_4_ * auVar11._4_4_;
      auVar61._0_4_ = auVar53._0_4_ * auVar11._0_4_;
      auVar61._8_4_ = auVar53._8_4_ * auVar11._8_4_;
      auVar61._12_4_ = auVar53._12_4_ * auVar11._12_4_;
      auVar61._16_4_ = auVar53._16_4_ * auVar11._16_4_;
      auVar61._20_4_ = auVar53._20_4_ * auVar11._20_4_;
      auVar61._24_4_ = auVar53._24_4_ * auVar11._24_4_;
      auVar61._28_4_ = auVar64._28_4_;
      auVar19 = vfmsub231ps_fma(auVar61,auVar69,auVar55);
      auVar62._4_4_ = auVar55._4_4_ * auVar59._4_4_;
      auVar62._0_4_ = auVar55._0_4_ * auVar59._0_4_;
      auVar62._8_4_ = auVar55._8_4_ * auVar59._8_4_;
      auVar62._12_4_ = auVar55._12_4_ * auVar59._12_4_;
      auVar62._16_4_ = auVar55._16_4_ * auVar59._16_4_;
      auVar62._20_4_ = auVar55._20_4_ * auVar59._20_4_;
      auVar62._24_4_ = auVar55._24_4_ * auVar59._24_4_;
      auVar62._28_4_ = auVar65._28_4_;
      auVar15 = vfmsub231ps_fma(auVar62,auVar11,auVar54);
      auVar63._4_4_ = auVar54._4_4_ * auVar69._4_4_;
      auVar63._0_4_ = auVar54._0_4_ * auVar69._0_4_;
      auVar63._8_4_ = auVar54._8_4_ * auVar69._8_4_;
      auVar63._12_4_ = auVar54._12_4_ * auVar69._12_4_;
      auVar63._16_4_ = auVar54._16_4_ * auVar69._16_4_;
      auVar63._20_4_ = auVar54._20_4_ * auVar69._20_4_;
      auVar63._24_4_ = auVar54._24_4_ * auVar69._24_4_;
      auVar63._28_4_ = auVar66._28_4_;
      auVar16 = vfmsub231ps_fma(auVar63,auVar59,auVar53);
      auVar30._4_4_ = auVar18._4_4_ * auVar55._4_4_;
      auVar30._0_4_ = auVar18._0_4_ * auVar55._0_4_;
      auVar30._8_4_ = auVar18._8_4_ * auVar55._8_4_;
      auVar30._12_4_ = auVar18._12_4_ * auVar55._12_4_;
      auVar30._16_4_ = auVar55._16_4_ * 0.0;
      auVar30._20_4_ = auVar55._20_4_ * 0.0;
      auVar30._24_4_ = auVar55._24_4_ * 0.0;
      auVar30._28_4_ = auVar55._28_4_;
      auVar51 = vfmadd231ps_fma(auVar30,(undefined1  [32])aVar71,auVar53);
      auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar70,auVar54);
      vandps_avx512vl(ZEXT1632(auVar51),auVar108._0_32_);
      auVar54 = vmulps_avx512vl(auVar68,ZEXT1632(auVar16));
      auVar54 = vfmadd231ps_avx512vl(auVar54,ZEXT1632(auVar15),auVar67);
      auVar17 = vfmadd231ps_fma(auVar54,ZEXT1632(auVar19),auVar58);
      uVar95 = auVar72._0_4_;
      auVar68._0_4_ = uVar95 ^ auVar17._0_4_;
      uVar96 = auVar72._4_4_;
      auVar68._4_4_ = uVar96 ^ auVar17._4_4_;
      uVar97 = auVar72._8_4_;
      auVar68._8_4_ = uVar97 ^ auVar17._8_4_;
      uVar98 = auVar72._12_4_;
      auVar68._12_4_ = uVar98 ^ auVar17._12_4_;
      uVar99 = auVar72._16_4_;
      auVar68._16_4_ = uVar99;
      uVar100 = auVar72._20_4_;
      auVar68._20_4_ = uVar100;
      uVar101 = auVar72._24_4_;
      auVar68._24_4_ = uVar101;
      uVar102 = auVar72._28_4_;
      auVar68._28_4_ = uVar102;
      uVar13 = vcmpps_avx512vl(auVar68,auVar109._0_32_,5);
      local_5d40._0_4_ = uVar44;
      bVar37 = (byte)uVar13 & (byte)uVar44;
      if (bVar37 == 0) {
LAB_01dd6609:
        bVar37 = 0;
      }
      else {
        auVar31._4_4_ = auVar57._4_4_ * auVar16._4_4_;
        auVar31._0_4_ = auVar57._0_4_ * auVar16._0_4_;
        auVar31._8_4_ = auVar57._8_4_ * auVar16._8_4_;
        auVar31._12_4_ = auVar57._12_4_ * auVar16._12_4_;
        auVar31._16_4_ = auVar57._16_4_ * 0.0;
        auVar31._20_4_ = auVar57._20_4_ * 0.0;
        auVar31._24_4_ = auVar57._24_4_ * 0.0;
        auVar31._28_4_ = auVar57._28_4_;
        auVar17 = vfmadd213ps_fma(ZEXT1632(auVar15),auVar56,auVar31);
        auVar17 = vfmadd213ps_fma(ZEXT1632(auVar19),auVar52,ZEXT1632(auVar17));
        auVar92._0_4_ = uVar95 ^ auVar17._0_4_;
        auVar92._4_4_ = uVar96 ^ auVar17._4_4_;
        auVar92._8_4_ = uVar97 ^ auVar17._8_4_;
        auVar92._12_4_ = uVar98 ^ auVar17._12_4_;
        auVar92._16_4_ = uVar99;
        auVar92._20_4_ = uVar100;
        auVar92._24_4_ = uVar101;
        auVar92._28_4_ = uVar102;
        uVar13 = vcmpps_avx512vl(auVar92,auVar109._0_32_,5);
        bVar37 = bVar37 & (byte)uVar13;
        if (bVar37 == 0) goto LAB_01dd6609;
        auVar29._8_4_ = 0x7fffffff;
        auVar29._0_8_ = 0x7fffffff7fffffff;
        auVar29._12_4_ = 0x7fffffff;
        auVar29._16_4_ = 0x7fffffff;
        auVar29._20_4_ = 0x7fffffff;
        auVar29._24_4_ = 0x7fffffff;
        auVar29._28_4_ = 0x7fffffff;
        vandps_avx512vl(ZEXT1632(auVar51),auVar29);
        auVar53 = vsubps_avx(auVar54,auVar68);
        uVar13 = vcmpps_avx512vl(auVar53,auVar92,5);
        bVar37 = bVar37 & (byte)uVar13;
        if (bVar37 == 0) goto LAB_01dd6609;
        auVar32._4_4_ = auVar11._4_4_ * auVar18._4_4_;
        auVar32._0_4_ = auVar11._0_4_ * auVar18._0_4_;
        auVar32._8_4_ = auVar11._8_4_ * auVar18._8_4_;
        auVar32._12_4_ = auVar11._12_4_ * auVar18._12_4_;
        auVar32._16_4_ = auVar11._16_4_ * 0.0;
        auVar32._20_4_ = auVar11._20_4_ * 0.0;
        auVar32._24_4_ = auVar11._24_4_ * 0.0;
        auVar32._28_4_ = auVar11._28_4_;
        auVar17 = vfmadd213ps_fma(auVar69,(undefined1  [32])aVar71,auVar32);
        auVar17 = vfmadd213ps_fma(auVar59,auVar70,ZEXT1632(auVar17));
        auVar87._0_4_ = auVar54._0_4_ * *(float *)(ray + 0x60);
        auVar87._4_4_ = auVar54._4_4_ * *(float *)(ray + 100);
        auVar87._8_4_ = auVar54._8_4_ * *(float *)(ray + 0x68);
        auVar87._12_4_ = auVar54._12_4_ * *(float *)(ray + 0x6c);
        auVar87._16_4_ = auVar54._16_4_ * *(float *)(ray + 0x70);
        auVar87._20_4_ = auVar54._20_4_ * *(float *)(ray + 0x74);
        auVar87._24_4_ = auVar54._24_4_ * *(float *)(ray + 0x78);
        auVar87._28_4_ = 0;
        auVar83._0_4_ = uVar95 ^ auVar17._0_4_;
        auVar83._4_4_ = uVar96 ^ auVar17._4_4_;
        auVar83._8_4_ = uVar97 ^ auVar17._8_4_;
        auVar83._12_4_ = uVar98 ^ auVar17._12_4_;
        auVar83._16_4_ = uVar99;
        auVar83._20_4_ = uVar100;
        auVar83._24_4_ = uVar101;
        auVar83._28_4_ = uVar102;
        auVar33._4_4_ = auVar54._4_4_ * *(float *)(ray + 0x104);
        auVar33._0_4_ = auVar54._0_4_ * *(float *)(ray + 0x100);
        auVar33._8_4_ = auVar54._8_4_ * *(float *)(ray + 0x108);
        auVar33._12_4_ = auVar54._12_4_ * *(float *)(ray + 0x10c);
        auVar33._16_4_ = auVar54._16_4_ * *(float *)(ray + 0x110);
        auVar33._20_4_ = auVar54._20_4_ * *(float *)(ray + 0x114);
        auVar33._24_4_ = auVar54._24_4_ * *(float *)(ray + 0x118);
        auVar33._28_4_ = auVar11._28_4_;
        uVar13 = vcmpps_avx512vl(auVar83,auVar33,2);
        uVar14 = vcmpps_avx512vl(auVar87,auVar83,1);
        bVar37 = bVar37 & (byte)uVar13 & (byte)uVar14;
        if (bVar37 == 0) {
LAB_01dd6b21:
          bVar37 = 0;
          aVar36 = local_5d00;
          aVar71 = local_5ce0;
          auVar70 = local_5cc0;
          auVar54 = local_5ca0;
          auVar83 = _local_5c80;
          auVar92 = _local_5c60;
          auVar68 = _local_5c40;
        }
        else {
          uVar13 = vcmpps_avx512vl(ZEXT1632(auVar51),ZEXT832(0) << 0x20,4);
          bVar37 = bVar37 & (byte)uVar13;
          aVar36 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar18);
          if (bVar37 == 0) goto LAB_01dd6b21;
        }
        _local_5c40 = auVar68;
        _local_5c60 = auVar92;
        _local_5c80 = auVar83;
        local_5ca0 = auVar54;
        local_5cc0 = auVar70;
        local_5ce0 = aVar71;
        local_5d00 = aVar36;
        auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar107 = ZEXT3264(auVar54);
        auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar108 = ZEXT3264(auVar54);
        auVar51 = vxorps_avx512vl(auVar109._0_16_,auVar109._0_16_);
        auVar109 = ZEXT1664(auVar51);
      }
      auVar51 = auVar109._0_16_;
      pGVar2 = (context->scene->geometries).items[uVar41].ptr;
      uVar95 = pGVar2->mask;
      auVar75._4_4_ = uVar95;
      auVar75._0_4_ = uVar95;
      auVar75._8_4_ = uVar95;
      auVar75._12_4_ = uVar95;
      auVar75._16_4_ = uVar95;
      auVar75._20_4_ = uVar95;
      auVar75._24_4_ = uVar95;
      auVar75._28_4_ = uVar95;
      uVar13 = vptestmd_avx512vl(auVar75,*(undefined1 (*) [32])(ray + 0x120));
      bVar37 = (byte)uVar13 & bVar37;
      if (bVar37 != 0) {
        local_5dd0 = CONCAT44(local_5dd0._4_4_,*(undefined4 *)(lVar47 + 0x10 + lVar48));
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar54 = vrcp14ps_avx512vl(local_5ca0);
          auVar28._8_4_ = 0x3f800000;
          auVar28._0_8_ = 0x3f8000003f800000;
          auVar28._12_4_ = 0x3f800000;
          auVar28._16_4_ = 0x3f800000;
          auVar28._20_4_ = 0x3f800000;
          auVar28._24_4_ = 0x3f800000;
          auVar28._28_4_ = 0x3f800000;
          auVar53 = vfnmadd213ps_avx512vl(auVar54,local_5ca0,auVar28);
          auVar17 = vfmadd132ps_fma(auVar53,auVar54,auVar54);
          fVar76 = auVar17._0_4_;
          fVar78 = auVar17._4_4_;
          fVar79 = auVar17._8_4_;
          fVar80 = auVar17._12_4_;
          local_5980._0_4_ = fVar76 * (float)local_5c60._0_4_;
          local_5980._4_4_ = fVar78 * (float)local_5c60._4_4_;
          local_5980._8_4_ = fVar79 * fStack_5c58;
          local_5980._12_4_ = fVar80 * fStack_5c54;
          local_5980._16_4_ = fStack_5c50 * 0.0;
          local_5980._20_4_ = fStack_5c4c * 0.0;
          local_5980._24_4_ = fStack_5c48 * 0.0;
          local_5980._28_4_ = 0;
          local_5a00._0_8_ = local_5cc0._0_8_;
          local_5a00._8_8_ = local_5cc0._8_8_;
          local_5a00._16_8_ = local_5cc0._16_8_;
          local_5a00._24_8_ = local_5cc0._24_8_;
          local_5a00.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5ce0;
          local_5a00.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5d00;
          local_59a0 = CONCAT44(fVar78 * (float)local_5c80._4_4_,fVar76 * (float)local_5c80._0_4_);
          uStack_5998 = CONCAT44(fVar80 * fStack_5c74,fVar79 * fStack_5c78);
          uStack_5990 = CONCAT44(fStack_5c6c * 0.0,fStack_5c70 * 0.0);
          uStack_5988 = CONCAT44(auVar54._28_4_,fStack_5c68 * 0.0);
          local_5960._4_4_ = fVar78 * (float)local_5c40._4_4_;
          local_5960._0_4_ = fVar76 * (float)local_5c40._0_4_;
          fStack_5958 = fVar79 * fStack_5c38;
          fStack_5954 = fVar80 * fStack_5c34;
          fStack_5950 = fStack_5c30 * 0.0;
          fStack_594c = fStack_5c2c * 0.0;
          fStack_5948 = fStack_5c28 * 0.0;
          uStack_5944 = local_5ca0._28_4_;
          local_5db0.valid = (int *)&local_5880;
          local_5db0.geometryUserPtr = &local_58e0;
          local_5db0.context = (RTCRayQueryContext *)&local_58c0;
          local_5db0.ray = (RTCRayN *)&local_58a0;
          local_5dc4 = (uint)bVar37;
          local_5db8 = pGVar2;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_5db0,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_5a00.field_0);
          local_5940 = vpbroadcastd_avx512vl();
          _local_5960 = vpbroadcastd_avx512vl();
          local_5a00._0_8_ = local_5880;
          local_5a00._8_8_ = uStack_5878;
          local_5a00._16_8_ = uStack_5870;
          local_5a00._24_8_ = uStack_5868;
          local_5a00.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5860;
          local_5a00.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5840;
          local_59a0 = local_58a0._0_8_;
          uStack_5998 = local_58a0._8_8_;
          uStack_5990 = local_58a0._16_8_;
          uStack_5988 = local_58a0._24_8_;
          local_5980 = local_58c0;
          vpcmpeqd_avx2(local_5940,local_5940);
          uStack_591c = context->user->instID[0];
          local_5920 = uStack_591c;
          uStack_5918 = uStack_591c;
          uStack_5914 = uStack_591c;
          uStack_5910 = uStack_591c;
          uStack_590c = uStack_591c;
          uStack_5908 = uStack_591c;
          uStack_5904 = uStack_591c;
          uStack_58fc = context->user->instPrimID[0];
          local_5900 = uStack_58fc;
          uStack_58f8 = uStack_58fc;
          uStack_58f4 = uStack_58fc;
          uStack_58f0 = uStack_58fc;
          uStack_58ec = uStack_58fc;
          uStack_58e8 = uStack_58fc;
          uStack_58e4 = uStack_58fc;
          local_5d80 = *(undefined1 (*) [32])(ray + 0x100);
          auVar54 = vblendmps_avx512vl(local_5d80,(undefined1  [32])local_58e0);
          bVar38 = (bool)((byte)local_5dc4 & 1);
          bVar4 = (bool)((byte)(local_5dc4 >> 1) & 1);
          bVar5 = (bool)((byte)(local_5dc4 >> 2) & 1);
          bVar6 = (bool)((byte)(local_5dc4 >> 3) & 1);
          bVar7 = (bool)((byte)(local_5dc4 >> 4) & 1);
          bVar9 = (bool)((byte)(local_5dc4 >> 5) & 1);
          bVar8 = (bool)((byte)(local_5dc4 >> 6) & 1);
          bVar10 = (bool)((byte)(local_5dc4 >> 7) & 1);
          *(uint *)(ray + 0x100) = (uint)bVar38 * auVar54._0_4_ | !bVar38 * uStack_58fc;
          *(uint *)(ray + 0x104) = (uint)bVar4 * auVar54._4_4_ | !bVar4 * uStack_58fc;
          *(uint *)(ray + 0x108) = (uint)bVar5 * auVar54._8_4_ | !bVar5 * uStack_58fc;
          *(uint *)(ray + 0x10c) = (uint)bVar6 * auVar54._12_4_ | !bVar6 * uStack_58fc;
          *(uint *)(ray + 0x110) = (uint)bVar7 * auVar54._16_4_ | !bVar7 * uStack_58fc;
          *(uint *)(ray + 0x114) = (uint)bVar9 * auVar54._20_4_ | !bVar9 * uStack_58fc;
          *(uint *)(ray + 0x118) = (uint)bVar8 * auVar54._24_4_ | !bVar8 * uStack_58fc;
          *(uint *)(ray + 0x11c) = (uint)bVar10 * auVar54._28_4_ | !bVar10 * uStack_58fc;
          local_5d20 = vpmovm2d_avx512vl((ulong)local_5dc4);
          local_5db0.valid = (int *)local_5d20;
          local_5db0.geometryUserPtr = local_5db8->userPtr;
          local_5db0.context = context->user;
          local_5db0.hit = (RTCHitN *)&local_5a00;
          local_5db0.N = 8;
          local_5db0.ray = (RTCRayN *)ray;
          if (local_5db8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*local_5db8->occlusionFilterN)(&local_5db0);
          }
          if (local_5d20 == (undefined1  [32])0x0) {
            uVar41 = 0;
            auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar107 = ZEXT3264(auVar54);
            auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar108 = ZEXT3264(auVar54);
            auVar51 = vxorps_avx512vl(auVar51,auVar51);
            auVar109 = ZEXT1664(auVar51);
          }
          else {
            p_Var3 = context->args->filter;
            if (p_Var3 == (RTCFilterFunctionN)0x0) {
              auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar107 = ZEXT3264(auVar54);
              auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar108 = ZEXT3264(auVar54);
              auVar51 = vxorps_avx512vl(auVar51,auVar51);
              auVar109 = ZEXT1664(auVar51);
            }
            else {
              auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar107 = ZEXT3264(auVar54);
              auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar108 = ZEXT3264(auVar54);
              auVar51 = vxorps_avx512vl(auVar51,auVar51);
              auVar109 = ZEXT1664(auVar51);
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((local_5db8->field_8).field_0x2 & 0x40) != 0)
                 ) {
                (*p_Var3)(&local_5db0);
                auVar51 = vxorps_avx512vl(auVar51,auVar51);
                auVar109 = ZEXT1664(auVar51);
                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar108 = ZEXT3264(auVar54);
                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar107 = ZEXT3264(auVar54);
              }
            }
            uVar41 = vptestmd_avx512vl(local_5d20,local_5d20);
            auVar54 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar38 = (bool)((byte)uVar41 & 1);
            auVar73._0_4_ =
                 (uint)bVar38 * auVar54._0_4_ | (uint)!bVar38 * *(int *)(local_5db0.ray + 0x100);
            bVar38 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar73._4_4_ =
                 (uint)bVar38 * auVar54._4_4_ | (uint)!bVar38 * *(int *)(local_5db0.ray + 0x104);
            bVar38 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar73._8_4_ =
                 (uint)bVar38 * auVar54._8_4_ | (uint)!bVar38 * *(int *)(local_5db0.ray + 0x108);
            bVar38 = (bool)((byte)(uVar41 >> 3) & 1);
            auVar73._12_4_ =
                 (uint)bVar38 * auVar54._12_4_ | (uint)!bVar38 * *(int *)(local_5db0.ray + 0x10c);
            bVar38 = (bool)((byte)(uVar41 >> 4) & 1);
            auVar73._16_4_ =
                 (uint)bVar38 * auVar54._16_4_ | (uint)!bVar38 * *(int *)(local_5db0.ray + 0x110);
            bVar38 = (bool)((byte)(uVar41 >> 5) & 1);
            auVar73._20_4_ =
                 (uint)bVar38 * auVar54._20_4_ | (uint)!bVar38 * *(int *)(local_5db0.ray + 0x114);
            bVar38 = (bool)((byte)(uVar41 >> 6) & 1);
            auVar73._24_4_ =
                 (uint)bVar38 * auVar54._24_4_ | (uint)!bVar38 * *(int *)(local_5db0.ray + 0x118);
            bVar38 = SUB81(uVar41 >> 7,0);
            auVar73._28_4_ =
                 (uint)bVar38 * auVar54._28_4_ | (uint)!bVar38 * *(int *)(local_5db0.ray + 0x11c);
            *(undefined1 (*) [32])(local_5db0.ray + 0x100) = auVar73;
          }
          bVar37 = (byte)uVar41;
          auVar74._0_4_ =
               (uint)(bVar37 & 1) * *(int *)local_5dc0 |
               (uint)!(bool)(bVar37 & 1) * local_5d80._0_4_;
          bVar38 = (bool)((byte)(uVar41 >> 1) & 1);
          auVar74._4_4_ = (uint)bVar38 * *(int *)(local_5dc0 + 4) | (uint)!bVar38 * local_5d80._4_4_
          ;
          bVar38 = (bool)((byte)(uVar41 >> 2) & 1);
          auVar74._8_4_ = (uint)bVar38 * *(int *)(local_5dc0 + 8) | (uint)!bVar38 * local_5d80._8_4_
          ;
          bVar38 = (bool)((byte)(uVar41 >> 3) & 1);
          auVar74._12_4_ =
               (uint)bVar38 * *(int *)(local_5dc0 + 0xc) | (uint)!bVar38 * local_5d80._12_4_;
          bVar38 = (bool)((byte)(uVar41 >> 4) & 1);
          auVar74._16_4_ =
               (uint)bVar38 * *(int *)(local_5dc0 + 0x10) | (uint)!bVar38 * local_5d80._16_4_;
          bVar38 = (bool)((byte)(uVar41 >> 5) & 1);
          auVar74._20_4_ =
               (uint)bVar38 * *(int *)(local_5dc0 + 0x14) | (uint)!bVar38 * local_5d80._20_4_;
          bVar38 = (bool)((byte)(uVar41 >> 6) & 1);
          auVar74._24_4_ =
               (uint)bVar38 * *(int *)(local_5dc0 + 0x18) | (uint)!bVar38 * local_5d80._24_4_;
          bVar38 = (bool)((byte)(uVar41 >> 7) & 1);
          auVar74._28_4_ =
               (uint)bVar38 * *(int *)(local_5dc0 + 0x1c) | (uint)!bVar38 * local_5d80._28_4_;
          *(undefined1 (*) [32])local_5dc0 = auVar74;
          uVar44 = local_5d40._0_4_;
        }
        uVar44 = CONCAT31((int3)(uVar44 >> 8),(byte)uVar44 & ~bVar37);
      }
      lVar48 = lVar48 + 4;
    } while ((char)uVar44 != '\0');
    uVar44 = 0;
LAB_01dd6b2a:
    lVar42 = local_5d48 + 1;
    lVar47 = lVar47 + 0x140;
    bVar39 = bVar39 & (byte)uVar44;
  } while (bVar39 != 0);
  bVar39 = 0;
LAB_01dd6b47:
  bVar39 = (byte)local_5df0 | ~bVar39;
  local_5df0 = (uint)bVar39;
  if (bVar39 == 0xff) {
    bVar39 = 0xff;
    goto LAB_01dd6c86;
  }
  auVar54 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_5a20._0_4_ =
       (uint)(bVar39 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar39 & 1) * local_5a20._0_4_;
  bVar38 = (bool)(bVar39 >> 1 & 1);
  local_5a20._4_4_ = (uint)bVar38 * auVar54._4_4_ | (uint)!bVar38 * local_5a20._4_4_;
  bVar38 = (bool)(bVar39 >> 2 & 1);
  local_5a20._8_4_ = (uint)bVar38 * auVar54._8_4_ | (uint)!bVar38 * local_5a20._8_4_;
  bVar38 = (bool)(bVar39 >> 3 & 1);
  local_5a20._12_4_ = (uint)bVar38 * auVar54._12_4_ | (uint)!bVar38 * local_5a20._12_4_;
  bVar38 = (bool)(bVar39 >> 4 & 1);
  local_5a20._16_4_ = (uint)bVar38 * auVar54._16_4_ | (uint)!bVar38 * local_5a20._16_4_;
  bVar38 = (bool)(bVar39 >> 5 & 1);
  local_5a20._20_4_ = (uint)bVar38 * auVar54._20_4_ | (uint)!bVar38 * local_5a20._20_4_;
  bVar38 = (bool)(bVar39 >> 6 & 1);
  local_5a20._24_4_ = (uint)bVar38 * auVar54._24_4_ | (uint)!bVar38 * local_5a20._24_4_;
  local_5a20._28_4_ =
       (uint)(bVar39 >> 7) * auVar54._28_4_ | (uint)!(bool)(bVar39 >> 7) * local_5a20._28_4_;
  goto LAB_01dd61e3;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }